

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QLayoutItem * __thiscall QToolBarAreaLayout::itemAt(QToolBarAreaLayout *this,int *x,int index)

{
  int iVar1;
  long lVar2;
  QToolBarAreaLayoutLine *pQVar3;
  ulong uVar4;
  bool bVar5;
  QLayoutItem *in_RAX;
  int i;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  lVar6 = 0;
  do {
    lVar2 = this->docks[lVar6].lines.d.size;
    iVar8 = 5;
    if (lVar2 != 0) {
      pQVar3 = this->docks[lVar6].lines.d.ptr;
      lVar7 = 0;
      do {
        uVar4 = pQVar3[lVar7].toolBarItems.d.size;
        bVar5 = uVar4 != 0;
        if (uVar4 == 0) {
LAB_004b8d5d:
          iVar8 = 0;
        }
        else {
          iVar1 = *x;
          iVar8 = iVar1 + 1;
          if (index == iVar1) {
            uVar9 = 0;
          }
          else {
            uVar9 = 0;
            do {
              if (uVar4 - 1 == uVar9) {
                *x = iVar8 + (int)uVar9;
                bVar5 = false;
                goto LAB_004b8d5d;
              }
              uVar9 = uVar9 + 1;
            } while (index - iVar1 != (int)uVar9);
            bVar5 = uVar9 < uVar4;
            iVar8 = iVar8 + (int)uVar9;
          }
          *x = iVar8;
          in_RAX = pQVar3[lVar7].toolBarItems.d.ptr[uVar9].widgetItem;
          iVar8 = 1;
        }
      } while ((!bVar5) && (lVar7 = lVar7 + 1, iVar8 = 5, lVar7 != lVar2));
    }
    if ((iVar8 != 5) && (iVar8 != 0)) {
      return in_RAX;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      return (QLayoutItem *)0x0;
    }
  } while( true );
}

Assistant:

QLayoutItem *QToolBarAreaLayout::itemAt(int *x, int index) const
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if ((*x)++ == index)
                    return line.toolBarItems.at(k).widgetItem;
            }
        }
    }

    return nullptr;
}